

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O3

uint32 Clasp::StatisticObject::registerArray<Clasp::ClaspStatistics::Impl::Arr>(void)

{
  int iVar1;
  Array_T *local_10;
  
  if (registerArray<Clasp::ClaspStatistics::Impl::Arr>()::vtab_s == '\0') {
    registerArray<Clasp::ClaspStatistics::Impl::Arr>();
  }
  if (registerArray<Clasp::ClaspStatistics::Impl::Arr>()::id == '\0') {
    iVar1 = __cxa_guard_acquire(&registerArray<Clasp::ClaspStatistics::Impl::Arr>()::id);
    if (iVar1 != 0) {
      local_10 = &registerArray<Clasp::ClaspStatistics::Impl::Arr>::vtab_s;
      bk_lib::
      pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
      ::push_back((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                   *)types_s,(I **)&local_10);
      registerArray<Clasp::ClaspStatistics::Impl::Arr>::id = types_s._8_4_ - 1;
      __cxa_guard_release(&registerArray<Clasp::ClaspStatistics::Impl::Arr>()::id);
    }
  }
  return registerArray<Clasp::ClaspStatistics::Impl::Arr>::id;
}

Assistant:

uint32 StatisticObject::registerArray() {
	static const struct Array_T : A {
		Array_T() : A(&Array_T::size, &Array_T::at) {}
		static uint32          size(ObjPtr obj)         { return toU32(static_cast<const T*>(obj)->size()); }
		static StatisticObject at(ObjPtr obj, uint32 i) { return static_cast<const T*>(obj)->at(i); }
	} vtab_s;
	static const uint32 id = registerType(&vtab_s);
	return id;
}